

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  pointer __s;
  int iVar7;
  char *pcVar8;
  string out;
  Rune r;
  StringPiece vec [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  StringPiece local_168;
  StringPiece *local_158;
  char *local_150;
  StringPiece local_148 [17];
  
  memset(local_148,0,0x110);
  uVar3 = MaxSubmatch(rewrite);
  iVar7 = 0;
  if ((uVar3 < 0x11) && (iVar7 = 0, (int)uVar3 <= re->num_captures_)) {
    __s = (str->_M_dataplus)._M_p;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    local_158 = rewrite;
    if ((long)str->_M_string_length < 0) {
      iVar7 = 0;
    }
    else {
      pcVar8 = __s + str->_M_string_length;
      iVar7 = 0;
      pcVar1 = (char *)0x0;
LAB_0023f20f:
      do {
        local_150 = pcVar1;
        if (maximum_global_replace_count <= iVar7 && maximum_global_replace_count != -1) {
LAB_0023f371:
          if (iVar7 == 0) {
            iVar7 = 0;
            goto LAB_0023f3ac;
          }
          break;
        }
        local_168.data_ = (str->_M_dataplus)._M_p;
        local_168.size_ = str->_M_string_length;
        bVar2 = Match(re,&local_168,(long)__s - (long)local_168.data_,local_168.size_,UNANCHORED,
                      local_148,uVar3 + 1);
        if (!bVar2) goto LAB_0023f371;
        if (__s < local_148[0].data_) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(&local_188,__s,(long)local_148[0].data_ - (long)__s);
        }
        if ((local_148[0].data_ == local_150) && (local_148[0].size_ == 0)) {
          if ((re->options_).encoding_ == EncodingUTF8) {
            lVar6 = (long)pcVar8 - (long)__s;
            if (3 < lVar6) {
              lVar6 = 4;
            }
            iVar4 = fullrune(__s,(int)lVar6);
            if (iVar4 == 0) goto LAB_0023f2fd;
            iVar5 = chartorune((Rune *)&local_168,__s);
            iVar4 = (int)local_168.data_;
            if (0x10ffff < (int)local_168.data_) {
              local_168.data_ = (const_pointer)CONCAT44(local_168.data_._4_4_,0xfffd);
              iVar5 = 1;
              iVar4 = 0xfffd;
            }
            if (iVar4 == 0xfffd && iVar5 == 1) goto LAB_0023f2fd;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_188,__s,(long)iVar5);
            __s = __s + iVar5;
          }
          else {
LAB_0023f2fd:
            if (__s < pcVar8) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_188,__s,1);
            }
            __s = __s + 1;
          }
          pcVar1 = local_150;
          if (pcVar8 < __s) goto LAB_0023f371;
          goto LAB_0023f20f;
        }
        Rewrite(re,&local_188,local_158,local_148,uVar3 + 1);
        __s = local_148[0].data_ + local_148[0].size_;
        iVar7 = iVar7 + 1;
        pcVar1 = __s;
      } while (__s <= pcVar8);
      if (__s < pcVar8) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_188,__s,(long)pcVar8 - (long)__s);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (&local_188,str);
    }
LAB_0023f3ac:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar7;
}

Assistant:

int RE2::GlobalReplace(std::string* str,
                       const RE2& re,
                       const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  std::string out;
  int count = 0;
  while (p <= ep) {
    if (maximum_global_replace_count != -1 &&
        count >= maximum_global_replace_count)
      break;
    if (!re.Match(*str, static_cast<size_t>(p - str->data()),
                  str->size(), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].data())
      out.append(p, vec[0].data() - p);
    if (vec[0].data() == lastend && vec[0].empty()) {
      // Disallow empty match at end of last match: skip ahead.
      //
      // fullrune() takes int, not ptrdiff_t. However, it just looks
      // at the leading byte and treats any length >= 4 the same.
      if (re.options().encoding() == RE2::Options::EncodingUTF8 &&
          fullrune(p, static_cast<int>(std::min(ptrdiff_t{4}, ep - p)))) {
        // re is in UTF-8 mode and there is enough left of str
        // to allow us to advance by up to UTFmax bytes.
        Rune r;
        int n = chartorune(&r, p);
        // Some copies of chartorune have a bug that accepts
        // encodings of values in (10FFFF, 1FFFFF] as valid.
        if (r > Runemax) {
          n = 1;
          r = Runeerror;
        }
        if (!(n == 1 && r == Runeerror)) {  // no decoding error
          out.append(p, n);
          p += n;
          continue;
        }
      }
      // Most likely, re is in Latin-1 mode. If it is in UTF-8 mode,
      // we fell through from above and the GIGO principle applies.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].data() + vec[0].size();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  using std::swap;
  swap(out, *str);
  return count;
}